

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNModAsi::gen_code(CTPNModAsi *this,int discard,int param_3)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  void *ctx;
  uchar in_stack_ffffffffffffffcf;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_18 [12];
  undefined4 local_c;
  
  uVar2 = 1;
  local_c = in_ESI;
  iVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x90))
                    (*(long **)(in_RDI + 8),in_ESI,1,5,"%=",*(undefined8 *)(in_RDI + 0x10),0,1,
                     local_18);
  if (iVar1 == 0) {
    CTPNBin::gen_binary_ca
              ((CTPNBin *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),in_stack_ffffffffffffffcf);
    (**(code **)(**(long **)(in_RDI + 8) + 0x90))
              (*(long **)(in_RDI + 8),local_c,2,5,"%=",0,0,1,local_18);
  }
  return;
}

Assistant:

void CTPNModAsi::gen_code(int discard, int)
{
    /* 
     *   ask the left subnode to generate a mod-and-assign; if it can't,
     *   handle it generically 
     */
    void *ctx;
    if (!left_->gen_code_asi(discard, 1, TC_ASI_MOD, "%=",
                             right_, FALSE, TRUE, &ctx))
    {
        /* 
         *   there's no special coding for this assignment type -- compute
         *   the result generically, then assign the result as a simple
         *   assignment, which cannot be refused 
         */
        gen_binary_ca(OPC_MOD);
        left_->gen_code_asi(discard, 2, TC_ASI_MOD, "%=",
                            0, FALSE, TRUE, &ctx);
    }
}